

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O2

Am_Wrapper * __thiscall Am_String_Data::Make_Unique(Am_String_Data *this)

{
  Am_String_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Am_String_Data *)operator_new(0x18);
    Am_String_Data(this_00,this->value,true);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

bool
Am_String_Data::operator==(const Am_String_Data &test_value) const
{
  return (this == &test_value) || !strcmp((const char *)test_value, value);
}